

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O2

void __thiscall
csv::internals::ThreadSafeDeque<csv::CSVRow>::kill_all(ThreadSafeDeque<csv::CSVRow> *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->_lock);
  this->_is_waitable = false;
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void kill_all() {
                std::unique_lock<std::mutex> lock{ this->_lock };
                this->_is_waitable = false;
                this->_cond.notify_all();
            }